

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.h
# Opt level: O2

double __thiscall embree::cos(embree *this,double __x)

{
  float *in_RSI;
  double dVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = (float)*(undefined8 *)in_RSI;
  fVar4 = (float)((ulong)*(undefined8 *)in_RSI >> 0x20);
  dVar1 = (double)CONCAT44(fVar4,fVar4);
  fVar2 = -1.0;
  if (3.1415927 <= fVar4 - fVar3) {
    fVar3 = 1.0;
  }
  else {
    if (6.283185307179586 < (double)fVar4) {
      dVar1 = floor((double)fVar4 / 6.283185307179586);
      fVar3 = fVar3 + (float)(dVar1 * -6.283185307179586);
      fVar4 = fVar4 + (float)(dVar1 * -6.283185307179586);
      *(ulong *)in_RSI = CONCAT44(fVar4,fVar3);
    }
    if (fVar3 < 0.0) {
      dVar1 = floor((double)fVar3 / 6.283185307179586);
      fVar3 = fVar3 + (float)(dVar1 * -6.283185307179586);
      *(ulong *)in_RSI = CONCAT44(fVar4 + (float)(dVar1 * -6.283185307179586),fVar3);
    }
    fVar3 = cosf(fVar3);
    fVar4 = cosf(in_RSI[1]);
    fVar2 = fVar4;
    if (fVar3 <= fVar4) {
      fVar2 = fVar3;
    }
    if (fVar3 <= fVar4) {
      fVar3 = fVar4;
    }
    dVar1 = 3.141592653589793;
    if ((*in_RSI < 3.1415927) && (dVar1 = (double)in_RSI[1], 3.141592653589793 < dVar1)) {
      fVar2 = -1.0;
    }
  }
  *(float *)this = fVar2;
  *(float *)(this + 4) = fVar3;
  return dVar1;
}

Assistant:

inline Interval1f cos(Interval1f interval)
{
  if (interval.upper-interval.lower >= M_PI) { return Interval1f(-1.0, 1.0); }
  if (interval.upper > TWO_PI)                 { interval = shift(interval, -TWO_PI*floor(interval.upper/TWO_PI)); }
  if (interval.lower < 0)                      { interval = shift(interval, -TWO_PI*floor(interval.lower/TWO_PI)); }
  float cosLower = cos(interval.lower);
  float cosUpper = cos(interval.upper);
  if (cosLower > cosUpper) swap(cosLower, cosUpper);
  if (interval.lower < M_PI && interval.upper > M_PI) cosLower = -1.0;
  return Interval1f(cosLower, cosUpper);
}